

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hdr_histogram_log_test.c
# Opt level: O3

char * test_string_encode_decode(void)

{
  _Bool _Var1;
  int iVar2;
  char *pcVar3;
  size_t base64_len;
  long lVar4;
  double b;
  hdr_histogram *histogram;
  hdr_histogram *hdr_new;
  char *data;
  hdr_histogram *local_28;
  hdr_histogram *local_20;
  double local_18;
  char *local_10;
  
  local_20 = (hdr_histogram *)0x0;
  hdr_alloc(3600000000,3,&local_28);
  lVar4 = 1;
  do {
    hdr_record_value(local_28,lVar4 * lVar4);
    lVar4 = lVar4 + 1;
  } while (lVar4 != 100);
  iVar2 = hdr_log_encode(local_28,&local_10);
  if (iVar2 == 0) {
    base64_len = strlen(local_10);
    iVar2 = hdr_log_decode(&local_20,local_10,base64_len);
    if (iVar2 == 0) {
      _Var1 = compare_histogram(local_28,local_20);
      if (_Var1) {
        local_18 = hdr_mean(local_28);
        b = hdr_mean(local_20);
        _Var1 = compare_double(local_18,b,0.001);
        pcVar3 = (char *)0x0;
        if (!_Var1) {
          pcVar3 = "Mean different after encode/decode";
        }
      }
      else {
        pcVar3 = "Histograms should be the same";
      }
    }
    else {
      pcVar3 = "Failed to decode histogram data";
    }
  }
  else {
    pcVar3 = "Failed to encode histogram data";
  }
  return pcVar3;
}

Assistant:

static char* test_string_encode_decode(void)
{
    int i;
    char *data;
    struct hdr_histogram *histogram, *hdr_new = NULL;

    hdr_alloc(INT64_C(3600) * 1000 * 1000, 3, &histogram);

    for (i = 1; i < 100; i++)
    {
        hdr_record_value(histogram, i*i);
    }

    mu_assert("Failed to encode histogram data", hdr_log_encode(histogram, &data) == 0);
    mu_assert("Failed to decode histogram data", hdr_log_decode(&hdr_new, data, strlen(data)) == 0);
    mu_assert("Histograms should be the same", compare_histogram(histogram, hdr_new));
    mu_assert("Mean different after encode/decode", compare_double(hdr_mean(histogram), hdr_mean(hdr_new), 0.001));

    return 0;
}